

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImRect ImGui::TableGetCellBgRect(ImGuiTable *table,int column_n)

{
  ImGuiTableColumn *pIVar1;
  float fVar2;
  float fVar3;
  ImRect IVar4;
  
  pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
  fVar2 = pIVar1->MinX;
  if (pIVar1->PrevVisibleColumn == -1) {
    fVar2 = fVar2 - table->CellSpacingX1;
  }
  fVar3 = pIVar1->MaxX;
  if (pIVar1->NextVisibleColumn == -1) {
    fVar3 = fVar3 + table->CellSpacingX2;
  }
  IVar4.Min.y = table->RowPosY1;
  IVar4.Min.x = fVar2;
  IVar4.Max.y = table->RowPosY2;
  IVar4.Max.x = fVar3;
  return IVar4;
}

Assistant:

ImRect  ImGui::TableGetCellBgRect(const ImGuiTable* table, int column_n)
{
    const ImGuiTableColumn* column = &table->Columns[column_n];
    float x1 = column->MinX;
    float x2 = column->MaxX;
    if (column->PrevVisibleColumn == -1)
        x1 -= table->CellSpacingX1;
    if (column->NextVisibleColumn == -1)
        x2 += table->CellSpacingX2;
    return ImRect(x1, table->RowPosY1, x2, table->RowPosY2);
}